

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void Options::saveOptions(OptionsData *optionsData)

{
  bool bVar1;
  mapped_type_conflict *pmVar2;
  mapped_type *pmVar3;
  key_type local_20 [4];
  OptionsData *local_10;
  OptionsData *optionsData_local;
  
  graphicMode = optionsData->graphicMode;
  tileSize = optionsData->tileSize;
  bVar1 = optionsData->imageToLoad_4;
  local_20[3] = 0;
  local_10 = optionsData;
  pmVar2 = std::
           map<BoardSize,_bool,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_bool>_>_>
           ::at(&imagesToLoad,local_20 + 3);
  *pmVar2 = (mapped_type_conflict)(bVar1 & 1);
  bVar1 = local_10->imageToLoad_5;
  local_20[2] = 1;
  pmVar2 = std::
           map<BoardSize,_bool,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_bool>_>_>
           ::at(&imagesToLoad,local_20 + 2);
  *pmVar2 = (mapped_type_conflict)(bVar1 & 1);
  bVar1 = local_10->imageToLoad_6;
  local_20[1] = 2;
  pmVar2 = std::
           map<BoardSize,_bool,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_bool>_>_>
           ::at(&imagesToLoad,local_20 + 1);
  *pmVar2 = (mapped_type_conflict)(bVar1 & 1);
  bVar1 = local_10->imageToLoad_7;
  local_20[0] = SEVEN;
  pmVar2 = std::
           map<BoardSize,_bool,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_bool>_>_>
           ::at(&imagesToLoad,local_20);
  *pmVar2 = (mapped_type_conflict)(bVar1 & 1);
  tileColor = local_10->squareColor;
  numberColor = local_10->numberColor;
  pmVar3 = std::
           map<TileSize,_FontSize,_std::less<TileSize>,_std::allocator<std::pair<const_TileSize,_FontSize>_>_>
           ::at(&Maps::tileSizeFontSize,&tileSize);
  fontSize = *pmVar3;
  return;
}

Assistant:

void Options::saveOptions( OptionsData&  optionsData )
{
    graphicMode = optionsData.graphicMode;
    tileSize = optionsData.tileSize;
    imagesToLoad.at( BoardSize::FOUR ) = optionsData.imageToLoad_4;
    imagesToLoad.at( BoardSize::FIVE ) = optionsData.imageToLoad_5;
    imagesToLoad.at( BoardSize::SIX ) = optionsData.imageToLoad_6;
    imagesToLoad.at( BoardSize::SEVEN ) = optionsData.imageToLoad_7;
    tileColor = optionsData.squareColor;
    numberColor = optionsData.numberColor;
    fontSize = Maps::tileSizeFontSize.at( tileSize );
}